

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEAngle.cpp
# Opt level: O0

bool __thiscall test_CEAngle::test_retrieve(test_CEAngle *this)

{
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<double> __l_03;
  initializer_list<double> __l_04;
  initializer_list<double> __l_05;
  initializer_list<double> __l_06;
  initializer_list<double> __l_07;
  initializer_list<double> __l_08;
  byte bVar1;
  vector *in_RDI;
  invalid_value *e_5;
  invalid_value *e_4;
  invalid_value *e_3;
  invalid_value *e_2;
  invalid_value *e_1;
  invalid_value *e;
  CEAngle test_ang3;
  CEAngle test_ang2;
  string dms_str;
  string hms_str;
  CEAngle test_ang;
  double test_deg;
  double angle;
  CEAngle *in_stack_fffffffffffff078;
  undefined7 in_stack_fffffffffffff080;
  undefined1 in_stack_fffffffffffff087;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff088;
  CEAngle *in_stack_fffffffffffff090;
  allocator<char> *in_stack_fffffffffffff098;
  allocator *paVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff0a0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff0a8;
  allocator_type *__a;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff0b0;
  CEAngle *in_stack_fffffffffffff0b8;
  size_type in_stack_fffffffffffff0c0;
  allocator *paVar3;
  CEAngleType *in_stack_fffffffffffff0f0;
  CEAngle *in_stack_fffffffffffff0f8;
  vector<double,_std::allocator<double>_> *angle_vec;
  CEAngle *in_stack_fffffffffffff100;
  CEAngle *in_stack_fffffffffffff128;
  undefined4 local_c80;
  allocator local_c79;
  string local_c78 [39];
  allocator local_c51;
  string local_c50 [32];
  undefined4 local_c30;
  allocator_type local_c29;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 *local_c10;
  undefined8 local_c08;
  undefined4 local_b90;
  allocator local_b89;
  string local_b88 [39];
  allocator local_b61;
  string local_b60 [32];
  undefined4 local_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 *local_b20;
  undefined8 local_b18;
  undefined4 local_aa0;
  allocator local_a99;
  string local_a98 [39];
  allocator local_a71;
  string local_a70 [32];
  undefined4 local_a50;
  undefined1 local_a49 [25];
  undefined1 *local_a30;
  undefined8 local_a28;
  undefined4 local_9b0;
  allocator local_9a9;
  string local_9a8 [39];
  allocator local_981;
  string local_980 [32];
  undefined4 local_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 *local_940;
  undefined8 local_938;
  undefined4 local_8c0;
  allocator local_8b9;
  string local_8b8 [39];
  allocator local_891;
  string local_890 [32];
  undefined4 local_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 *local_850;
  undefined8 local_848;
  undefined4 local_7d0;
  allocator local_7c9;
  string local_7c8 [39];
  allocator local_7a1;
  string local_7a0 [32];
  undefined4 local_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 *local_760;
  undefined8 local_758;
  undefined4 local_728;
  allocator local_721;
  string local_720 [32];
  double local_700;
  double local_6f8;
  CEAngle local_6f0;
  undefined4 local_6e0;
  allocator local_6d9;
  string local_6d8 [32];
  double local_6b8;
  double local_6b0;
  undefined4 local_6a8;
  allocator local_6a1;
  string local_6a0 [40];
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 *local_650;
  undefined8 local_648;
  string local_640 [24];
  vector local_628 [24];
  undefined4 local_610;
  allocator local_609;
  string local_608 [39];
  allocator local_5e1;
  string local_5e0 [39];
  allocator<char> local_5b9;
  undefined8 local_5b8;
  char *local_5b0;
  undefined8 local_5a8;
  string local_5a0 [39];
  undefined1 local_579;
  string local_578 [32];
  undefined4 local_558;
  allocator local_551;
  string local_550 [40];
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 *local_508;
  undefined8 local_500;
  string local_4f8 [24];
  vector local_4e0 [24];
  undefined4 local_4c8;
  allocator local_4c1;
  string local_4c0 [39];
  allocator local_499;
  string local_498 [39];
  allocator<char> local_471;
  undefined8 local_470;
  char *local_468;
  undefined8 local_460;
  string local_458 [39];
  undefined1 local_431;
  string local_430 [32];
  undefined4 local_410;
  allocator local_409;
  string local_408 [32];
  double local_3e8;
  double local_3e0;
  undefined4 local_3d8;
  allocator local_3d1;
  string local_3d0 [32];
  double local_3b0;
  undefined8 local_3a8;
  CEAngle local_3a0;
  double local_390;
  undefined4 local_388;
  allocator local_381;
  string local_380 [40];
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 *local_330;
  undefined8 local_328;
  CEAngle local_308;
  double local_2f8;
  undefined4 local_2f0;
  allocator local_2e9;
  string local_2e8 [39];
  undefined1 local_2c1;
  CEAngle local_2c0;
  double local_2b0;
  undefined4 local_2a8;
  allocator local_2a1;
  string local_2a0 [39];
  undefined1 local_279;
  CEAngle local_278;
  double local_268;
  undefined4 local_260;
  allocator local_259;
  string local_258 [39];
  undefined1 local_231;
  CEAngle local_230;
  double local_220;
  undefined4 local_218;
  allocator local_211;
  string local_210 [40];
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 *local_1c0;
  undefined8 local_1b8;
  CEAngle local_198;
  double local_188;
  undefined4 local_180;
  allocator local_179;
  string local_178 [39];
  undefined1 local_151;
  CEAngle local_150;
  double local_140;
  undefined4 local_138;
  allocator local_131;
  string local_130 [39];
  undefined1 local_109;
  CEAngle local_108;
  double local_f8;
  undefined4 local_f0;
  allocator local_e9;
  string local_e8 [39];
  undefined1 local_c1;
  CEAngle local_c0;
  double local_b0;
  undefined4 local_a8;
  allocator local_a1;
  string local_a0 [32];
  CEAngle local_80;
  double local_70;
  undefined4 local_68;
  allocator local_61;
  string local_60 [48];
  undefined8 local_30;
  CEAngle local_28;
  double local_18 [3];
  
  local_18[1] = 3.141592653589793;
  local_30 = 0x4066800000000000;
  CEAngle::Deg((double *)in_stack_fffffffffffff0b8);
  local_18[0] = CEAngle::operator_cast_to_double(&local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"test_retrieve",&local_61);
  local_68 = 0xb0;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,local_18,local_18 + 1,local_60,&local_68);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  CEAngle::~CEAngle((CEAngle *)0x11eb22);
  CEAngle::Rad((double *)in_stack_fffffffffffff0b8);
  local_70 = CEAngle::operator_cast_to_double(&local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"test_retrieve",&local_a1);
  local_a8 = 0xb2;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_70,local_18 + 1,local_a0,&local_a8);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  CEAngle::~CEAngle((CEAngle *)0x11ec01);
  local_c1 = 0;
  CEAngle::Hms(in_stack_fffffffffffff0a8._M_current,(char *)in_stack_fffffffffffff0a0);
  local_b0 = CEAngle::operator_cast_to_double(&local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"test_retrieve",&local_e9);
  local_f0 = 0xb4;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_b0,local_18 + 1,local_e8,&local_f0);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  CEAngle::~CEAngle((CEAngle *)0x11ecef);
  local_109 = 0;
  CEAngle::Hms(in_stack_fffffffffffff0a8._M_current,(char *)in_stack_fffffffffffff0a0);
  local_f8 = CEAngle::operator_cast_to_double(&local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"test_retrieve",&local_131);
  local_138 = 0xb5;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_f8,local_18 + 1,local_130,&local_138);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  CEAngle::~CEAngle((CEAngle *)0x11eddd);
  local_151 = 0x2e;
  CEAngle::Hms(in_stack_fffffffffffff0a8._M_current,(char *)in_stack_fffffffffffff0a0);
  local_140 = CEAngle::operator_cast_to_double(&local_150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"test_retrieve",&local_179);
  local_180 = 0xb6;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_140,local_18 + 1,local_178,&local_180);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  CEAngle::~CEAngle((CEAngle *)0x11eecb);
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_1e8 = 0x4028000000000000;
  uStack_1e0 = 0;
  local_1c0 = &local_1e8;
  local_1b8 = 4;
  std::allocator<double>::allocator((allocator<double> *)0x11ef2d);
  __l._M_len = in_stack_fffffffffffff0c0;
  __l._M_array = (iterator)in_stack_fffffffffffff0b8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0b0._M_current,__l,
             (allocator_type *)in_stack_fffffffffffff0a8._M_current);
  CEAngle::Hms((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff098);
  local_188 = CEAngle::operator_cast_to_double(&local_198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"test_retrieve",&local_211);
  local_218 = 0xb8;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_188,local_18 + 1,local_210,&local_218);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  CEAngle::~CEAngle((CEAngle *)0x11f02d);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090);
  std::allocator<double>::~allocator((allocator<double> *)0x11f047);
  local_231 = 0;
  CEAngle::Dms(in_stack_fffffffffffff0a8._M_current,(char *)in_stack_fffffffffffff0a0);
  local_220 = CEAngle::operator_cast_to_double(&local_230);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"test_retrieve",&local_259);
  local_260 = 0xba;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_220,local_18 + 1,local_258,&local_260);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  CEAngle::~CEAngle((CEAngle *)0x11f135);
  local_279 = 0;
  CEAngle::Dms(in_stack_fffffffffffff0a8._M_current,(char *)in_stack_fffffffffffff0a0);
  local_268 = CEAngle::operator_cast_to_double(&local_278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"test_retrieve",&local_2a1);
  local_2a8 = 0xbb;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_268,local_18 + 1,local_2a0,&local_2a8);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  CEAngle::~CEAngle((CEAngle *)0x11f223);
  local_2c1 = 0x27;
  CEAngle::Dms(in_stack_fffffffffffff0a8._M_current,(char *)in_stack_fffffffffffff0a0);
  local_2b0 = CEAngle::operator_cast_to_double(&local_2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"test_retrieve",&local_2e9);
  local_2f0 = 0xbc;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_2b0,local_18 + 1,local_2e8,&local_2f0);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  CEAngle::~CEAngle((CEAngle *)0x11f311);
  local_348 = 0;
  uStack_340 = 0;
  local_358 = 0x4066800000000000;
  uStack_350 = 0;
  local_330 = &local_358;
  local_328 = 4;
  std::allocator<double>::allocator((allocator<double> *)0x11f373);
  __l_00._M_len = in_stack_fffffffffffff0c0;
  __l_00._M_array = (iterator)in_stack_fffffffffffff0b8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0b0._M_current,__l_00,
             (allocator_type *)in_stack_fffffffffffff0a8._M_current);
  CEAngle::Dms((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff098);
  local_2f8 = CEAngle::operator_cast_to_double(&local_308);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_380,"test_retrieve",&local_381);
  local_388 = 0xbe;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_2f8,local_18 + 1,local_380,&local_388);
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  CEAngle::~CEAngle((CEAngle *)0x11f473);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090);
  std::allocator<double>::~allocator((allocator<double> *)0x11f48d);
  local_390 = 315.25;
  local_3a8 = 0x40160233bb643c1c;
  CEAngle::CEAngle(in_stack_fffffffffffff090,(double *)in_stack_fffffffffffff088);
  local_3b0 = CEAngle::Deg(&local_3a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d0,"test_retrieve",&local_3d1);
  local_3d8 = 0xc6;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_3b0,&local_390,local_3d0,&local_3d8);
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  local_3e0 = CEAngle::Rad(&local_3a0);
  local_3e8 = local_390 * 0.017453292519943295;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,"test_retrieve",&local_409);
  local_410 = 0xc9;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_3e0,&local_3e8,local_408,&local_410);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  local_431 = 0x27;
  CEAngle::HmsStr_abi_cxx11_(in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0._M_current);
  local_460 = std::__cxx11::string::begin();
  local_470 = std::__cxx11::string::begin();
  local_468 = (char *)__gnu_cxx::
                      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator+(in_stack_fffffffffffff088,
                                  CONCAT17(in_stack_fffffffffffff087,in_stack_fffffffffffff080));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            (in_stack_fffffffffffff0a0,in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,
             in_stack_fffffffffffff098);
  std::__cxx11::string::operator=(local_430,local_458);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator(&local_471);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_498,"21\'01\'00.00",&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c0,"test_retrieve",&local_4c1);
  local_4c8 = 0xce;
  (**(code **)(*(long *)in_RDI + 0x70))(in_RDI,local_430,local_498,local_4c0,&local_4c8);
  std::__cxx11::string::~string(local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  CEAngle::HmsVect(in_stack_fffffffffffff0f8);
  local_518 = 0;
  uStack_510 = 0;
  local_528 = 0x4035000000000000;
  uStack_520 = 0x3ff0000000000000;
  local_508 = &local_528;
  local_500 = 4;
  std::allocator<double>::allocator((allocator<double> *)0x11f886);
  __l_01._M_len = in_stack_fffffffffffff0c0;
  __l_01._M_array = (iterator)in_stack_fffffffffffff0b8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0b0._M_current,__l_01,
             (allocator_type *)in_stack_fffffffffffff0a8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_550,"test_retrieve",&local_551);
  local_558 = 0xd1;
  CETestSuite::test_vect(in_RDI,local_4e0,local_4f8,(int *)local_550);
  std::__cxx11::string::~string(local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090);
  std::allocator<double>::~allocator((allocator<double> *)0x11f94e);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090);
  local_579 = 0x22;
  CEAngle::DmsStr_abi_cxx11_(in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0._M_current);
  local_5a8 = std::__cxx11::string::begin();
  local_5b8 = std::__cxx11::string::begin();
  local_5b0 = (char *)__gnu_cxx::
                      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator+(in_stack_fffffffffffff088,
                                  CONCAT17(in_stack_fffffffffffff087,in_stack_fffffffffffff080));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            (in_stack_fffffffffffff0a0,in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,
             in_stack_fffffffffffff098);
  std::__cxx11::string::operator=(local_578,local_5a0);
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator(&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e0,"315\"15\"00.00",&local_5e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_608,"test_retrieve",&local_609);
  local_610 = 0xd6;
  (**(code **)(*(long *)in_RDI + 0x70))(in_RDI,local_578,local_5e0,local_608,&local_610);
  std::__cxx11::string::~string(local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  std::__cxx11::string::~string(local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  CEAngle::DmsVect(in_stack_fffffffffffff128);
  local_668 = 0;
  uStack_660 = 0;
  local_678 = 0x4073b00000000000;
  uStack_670 = 0x402e000000000000;
  local_650 = &local_678;
  local_648 = 4;
  std::allocator<double>::allocator((allocator<double> *)0x11fb7f);
  __l_02._M_len = in_stack_fffffffffffff0c0;
  __l_02._M_array = (iterator)in_stack_fffffffffffff0b8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0b0._M_current,__l_02,
             (allocator_type *)in_stack_fffffffffffff0a8._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a0,"test_retrieve",&local_6a1);
  local_6a8 = 0xd9;
  CETestSuite::test_vect(in_RDI,local_628,local_640,(int *)local_6a0);
  std::__cxx11::string::~string(local_6a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090);
  std::allocator<double>::~allocator((allocator<double> *)0x11fc47);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090);
  local_6b0 = CEAngle::operator_cast_to_double(&local_3a0);
  local_6b8 = local_390 * 0.017453292519943295;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d8,"test_retrieve",&local_6d9);
  local_6e0 = 0xdc;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_6b0,&local_6b8,local_6d8,&local_6e0);
  std::__cxx11::string::~string(local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
  CEAngle::CEAngle((CEAngle *)CONCAT17(in_stack_fffffffffffff087,in_stack_fffffffffffff080),
                   in_stack_fffffffffffff078);
  local_6f8 = CEAngle::operator_cast_to_double(&local_6f0);
  local_700 = local_390 * 0.017453292519943295;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_720,"test_retrieve",&local_721);
  local_728 = 0xdf;
  (**(code **)(*(long *)in_RDI + 0x58))(in_RDI,&local_6f8,&local_700,local_720,&local_728);
  std::__cxx11::string::~string(local_720);
  std::allocator<char>::~allocator((allocator<char> *)&local_721);
  CEAngle::CEAngle((CEAngle *)0x11fe1e);
  local_778 = 0x4039000000000000;
  uStack_770 = 0x4000000000000000;
  local_768 = 0x400a666666666666;
  local_760 = &local_778;
  local_758 = 3;
  std::allocator<double>::allocator((allocator<double> *)0x11fe72);
  __l_03._M_len = in_stack_fffffffffffff0c0;
  __l_03._M_array = (iterator)in_stack_fffffffffffff0b8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0b0._M_current,__l_03,
             (allocator_type *)in_stack_fffffffffffff0a8._M_current);
  local_780 = 2;
  CEAngle::SetAngle(in_stack_fffffffffffff100,
                    (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0f8,
                    in_stack_fffffffffffff0f0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090);
  std::allocator<double>::~allocator((allocator<double> *)0x11fedd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7a0,"HMS bad hours exception",&local_7a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7c8,"test_retrieve",&local_7c9);
  local_7d0 = 0xe8;
  (**(code **)(*(long *)in_RDI + 0x50))(in_RDI,0,local_7a0,local_7c8,&local_7d0);
  std::__cxx11::string::~string(local_7c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
  std::__cxx11::string::~string(local_7a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
  local_868 = 0x3ff0000000000000;
  uStack_860 = 0xc000000000000000;
  local_858 = 0x400a666666666666;
  local_850 = &local_868;
  local_848 = 3;
  std::allocator<double>::allocator((allocator<double> *)0x120a63);
  __l_04._M_len = in_stack_fffffffffffff0c0;
  __l_04._M_array = (iterator)in_stack_fffffffffffff0b8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0b0._M_current,__l_04,
             (allocator_type *)in_stack_fffffffffffff0a8._M_current);
  local_870 = 2;
  CEAngle::SetAngle(in_stack_fffffffffffff100,
                    (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0f8,
                    in_stack_fffffffffffff0f0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090);
  std::allocator<double>::~allocator((allocator<double> *)0x120ace);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_890,"HMS bad minutes exception",&local_891);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8b8,"test_retrieve",&local_8b9);
  local_8c0 = 0xef;
  (**(code **)(*(long *)in_RDI + 0x50))(in_RDI,0,local_890,local_8b8,&local_8c0);
  std::__cxx11::string::~string(local_8b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8b9);
  std::__cxx11::string::~string(local_890);
  std::allocator<char>::~allocator((allocator<char> *)&local_891);
  local_958 = 0x3ff0000000000000;
  uStack_950 = 0x4000000000000000;
  local_948 = 0xc00a666666666666;
  local_940 = &local_958;
  local_938 = 3;
  std::allocator<double>::allocator((allocator<double> *)0x120e51);
  __l_05._M_len = in_stack_fffffffffffff0c0;
  __l_05._M_array = (iterator)in_stack_fffffffffffff0b8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0b0._M_current,__l_05,
             (allocator_type *)in_stack_fffffffffffff0a8._M_current);
  local_960 = 2;
  CEAngle::SetAngle(in_stack_fffffffffffff100,
                    (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0f8,
                    in_stack_fffffffffffff0f0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090);
  std::allocator<double>::~allocator((allocator<double> *)0x120ebc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_980,"HMS bad seconds exception",&local_981);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9a8,"test_retrieve",&local_9a9);
  local_9b0 = 0xf6;
  (**(code **)(*(long *)in_RDI + 0x50))(in_RDI,0,local_980,local_9a8,&local_9b0);
  std::__cxx11::string::~string(local_9a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9a9);
  std::__cxx11::string::~string(local_980);
  std::allocator<char>::~allocator((allocator<char> *)&local_981);
  local_a49._1_8_ = 0x4077200000000000;
  local_a49._9_8_ = 0x4000000000000000;
  local_a49._17_8_ = 0x400a666666666666;
  local_a30 = local_a49 + 1;
  local_a28 = 3;
  angle_vec = (vector<double,_std::allocator<double>_> *)local_a49;
  std::allocator<double>::allocator((allocator<double> *)0x121226);
  __l_06._M_len = in_stack_fffffffffffff0c0;
  __l_06._M_array = (iterator)in_stack_fffffffffffff0b8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0b0._M_current,__l_06,
             (allocator_type *)in_stack_fffffffffffff0a8._M_current);
  local_a50 = 3;
  CEAngle::SetAngle(in_stack_fffffffffffff100,angle_vec,in_stack_fffffffffffff0f0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090);
  std::allocator<double>::~allocator((allocator<double> *)0x121291);
  paVar2 = &local_a71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a70,"DMS bad degrees exception",paVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a98,"test_retrieve",&local_a99);
  local_aa0 = 0xfe;
  (**(code **)(*(long *)in_RDI + 0x50))(in_RDI,0,local_a70,local_a98,&local_aa0);
  std::__cxx11::string::~string(local_a98);
  std::allocator<char>::~allocator((allocator<char> *)&local_a99);
  std::__cxx11::string::~string(local_a70);
  std::allocator<char>::~allocator((allocator<char> *)&local_a71);
  local_b38 = 0x3ff0000000000000;
  uStack_b30 = 0xc000000000000000;
  local_b28 = 0x400a666666666666;
  local_b20 = &local_b38;
  local_b18 = 3;
  std::allocator<double>::allocator((allocator<double> *)0x1215e0);
  __l_07._M_len = in_stack_fffffffffffff0c0;
  __l_07._M_array = (iterator)in_stack_fffffffffffff0b8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0b0._M_current,__l_07,
             (allocator_type *)in_stack_fffffffffffff0a8._M_current);
  local_b40 = 3;
  CEAngle::SetAngle(in_stack_fffffffffffff100,angle_vec,(CEAngleType *)paVar2);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090);
  std::allocator<double>::~allocator((allocator<double> *)0x121648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b60,"DMS bad arcmins exception",&local_b61);
  paVar3 = &local_b89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b88,"test_retrieve",paVar3);
  local_b90 = 0x105;
  (**(code **)(*(long *)in_RDI + 0x50))(in_RDI,0,local_b60,local_b88,&local_b90);
  std::__cxx11::string::~string(local_b88);
  std::allocator<char>::~allocator((allocator<char> *)&local_b89);
  std::__cxx11::string::~string(local_b60);
  std::allocator<char>::~allocator((allocator<char> *)&local_b61);
  local_c28 = 0x3ff0000000000000;
  uStack_c20 = 0x4000000000000000;
  local_c18 = 0xc00a666666666666;
  local_c10 = &local_c28;
  local_c08 = 3;
  __a = &local_c29;
  std::allocator<double>::allocator((allocator<double> *)0x121997);
  __l_08._M_len = (size_type)paVar3;
  __l_08._M_array = (iterator)in_stack_fffffffffffff0b8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0b0._M_current,__l_08,
             __a);
  local_c30 = 3;
  CEAngle::SetAngle(in_stack_fffffffffffff100,angle_vec,(CEAngleType *)paVar2);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff090);
  std::allocator<double>::~allocator((allocator<double> *)0x1219ff);
  paVar2 = &local_c51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c50,"DMS bad arcsecs exception",paVar2);
  paVar2 = &local_c79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c78,"test_retrieve",paVar2);
  local_c80 = 0x10c;
  (**(code **)(*(long *)in_RDI + 0x50))(in_RDI,0,local_c50,local_c78,&local_c80);
  std::__cxx11::string::~string(local_c78);
  std::allocator<char>::~allocator((allocator<char> *)&local_c79);
  std::__cxx11::string::~string(local_c50);
  std::allocator<char>::~allocator((allocator<char> *)&local_c51);
  bVar1 = (**(code **)(*(long *)in_RDI + 0x18))();
  CEAngle::~CEAngle((CEAngle *)0x121d23);
  CEAngle::~CEAngle((CEAngle *)0x121d30);
  std::__cxx11::string::~string(local_578);
  std::__cxx11::string::~string(local_430);
  CEAngle::~CEAngle((CEAngle *)0x121d57);
  return (bool)(bVar1 & 1);
}

Assistant:

bool test_CEAngle::test_retrieve(void)
{
    double angle = M_PI;

    // Test getting from...
    // ... degrees
    test_double(CEAngle::Deg(180), angle, __func__, __LINE__);
    // ... radians
    test_double(CEAngle::Rad(angle), angle, __func__, __LINE__);
    // ... Hms (version 1)
    test_double(CEAngle::Hms("12:00:00"), angle, __func__, __LINE__);
    test_double(CEAngle::Hms("12 00 00"), angle, __func__, __LINE__);
    test_double(CEAngle::Hms("12.00.00", '.'), angle, __func__, __LINE__);
    // ... HMS (version 2)
    test_double(CEAngle::Hms({12.0, 0.0, 0.0, 0.0}), angle, __func__, __LINE__);
    // ... Dms (version 1)
    test_double(CEAngle::Dms("180:00:00"), angle, __func__, __LINE__);
    test_double(CEAngle::Dms("180 00 00"), angle, __func__, __LINE__);
    test_double(CEAngle::Dms("180'00'00", '\''), angle, __func__, __LINE__);
    // ... DMS (version 2)
    test_double(CEAngle::Dms({180, 0, 0, 0.0}), angle, __func__, __LINE__);

    // Now test some of the other ways in which to get back the angle using
    // a particular format. For this, we will use 315.25 degrees
    double test_deg = 315.25;
    CEAngle test_ang(test_deg * DD2R);

    // Deg
    test_double(test_ang.Deg(), test_deg, __func__, __LINE__);

    // Rad
    test_double(test_ang.Rad(), test_deg*DD2R, __func__, __LINE__);
    
    // HMS as string
    std::string hms_str = test_ang.HmsStr('\'');
    hms_str = std::string(hms_str.begin(), hms_str.begin()+11);
    test_string(hms_str, "21'01'00.00", __func__, __LINE__);
    
    // HMS as vector<double>
    test_vect(test_ang.HmsVect(), {21, 1, 0, 0}, __func__, __LINE__);
    
    // DMS as string
    std::string dms_str = test_ang.DmsStr('"');
    dms_str = std::string(dms_str.begin(), dms_str.begin()+12);
    test_string(dms_str, "315\"15\"00.00", __func__, __LINE__);

    // DMS as vector<double>
    test_vect(test_ang.DmsVect(), {315, 15, 0, 0}, __func__, __LINE__);

    // Can the angle be retrieved directly as a double?
    test_double(test_ang, test_deg*DD2R, __func__, __LINE__);
    const CEAngle test_ang2(test_ang);
    // Test 'const' version
    test_double(test_ang2, test_deg*DD2R, __func__, __LINE__);


    // Test exceptions
    CEAngle test_ang3;

    // Incorrect hour
    try {
        test_ang3.SetAngle({25, 2, 3.3}, CEAngleType::HMS);
        test(false, "HMS bad hours exception", __func__, __LINE__);
    } catch (CEException::invalid_value& e) {
        test(true, "HMS bad hours exception", __func__, __LINE__);
    }
    // Incorrect minutes
    try {
        test_ang3.SetAngle({1, -2, 3.3}, CEAngleType::HMS);
        test(false, "HMS bad minutes exception", __func__, __LINE__);
    } catch (CEException::invalid_value& e) {
        test(true, "HMS bad minutes exception", __func__, __LINE__);
    }
    // Incorrect seconds
    try {
        test_ang3.SetAngle({1, 2, -3.3}, CEAngleType::HMS);
        test(false, "HMS bad seconds exception", __func__, __LINE__);
    } catch (CEException::invalid_value& e) {
        test(true, "HMS bad seconds exception", __func__, __LINE__);
    }

    // Incorrect degrees
    try {
        test_ang3.SetAngle({370, 2, 3.3}, CEAngleType::DMS);
        test(false, "DMS bad degrees exception", __func__, __LINE__);
    } catch (CEException::invalid_value& e) {
        test(true, "DMS bad degrees exception", __func__, __LINE__);
    }
    // Incorrect minutes
    try {
        test_ang3.SetAngle({1, -2, 3.3}, CEAngleType::DMS);
        test(false, "DMS bad arcmins exception", __func__, __LINE__);
    } catch (CEException::invalid_value& e) {
        test(true, "DMS bad arcmins exception", __func__, __LINE__);
    }
    // Incorrect seconds
    try {
        test_ang3.SetAngle({1, 2, -3.3}, CEAngleType::DMS);
        test(false, "DMS bad arcsecs exception", __func__, __LINE__);
    } catch (CEException::invalid_value& e) {
        test(true, "DMS bad arcsecs exception", __func__, __LINE__);
    }

    return pass();
}